

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void sha384_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  int in_EDX;
  uchar *in_RSI;
  void *in_RDI;
  SHA512_CTX copy;
  sha384_context_t *ctx;
  SHA512_CTX local_f8;
  void *local_20;
  int local_14;
  uchar *local_10;
  
  if (in_EDX == 2) {
    local_10 = in_RSI;
    memcpy(&local_f8,(void *)((long)in_RDI + 0x18),0xd8);
    SHA384_Final(local_10,&local_f8);
    (*ptls_clear_memory)(&local_f8,0xd8);
  }
  else {
    local_20 = in_RDI;
    local_14 = in_EDX;
    if (in_RSI != (uchar *)0x0) {
      SHA384_Final(in_RSI,(SHA512_CTX *)((long)in_RDI + 0x18));
    }
    if (local_14 == 0) {
      (*ptls_clear_memory)((void *)((long)local_20 + 0x18),0xd8);
      free(local_20);
    }
    else {
      if (local_14 != 1) {
        __assert_fail("!\"FIXME\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                      ,0x410,
                      "void sha384_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
      }
      SHA384_Init((SHA512_CTX *)((long)local_20 + 0x18));
    }
  }
  return;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, uint16_t *selected_algorithm, ptls_buffer_t *outbuf,
                            ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const struct st_ptls_openssl_signature_scheme_t *scheme;

    /* select the algorithm (driven by server-side preference of `self->schemes`) */
    for (scheme = self->schemes; scheme->scheme_id != UINT16_MAX; ++scheme) {
        size_t i;
        for (i = 0; i != num_algorithms; ++i)
            if (algorithms[i] == scheme->scheme_id)
                goto Found;
    }
    return PTLS_ALERT_HANDSHAKE_FAILURE;

Found:
    *selected_algorithm = scheme->scheme_id;
    return do_sign(self->key, scheme, outbuf, input);
}